

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

void tree_insert(Node *root,int x,int y,int p,int q)

{
  _Rb_tree_header *p_Var1;
  pointer *ppptVar2;
  pointer pptVar3;
  pointer pcVar4;
  Node ptVar5;
  iterator __position;
  bool bVar6;
  tNode *ptVar7;
  long lVar8;
  mapped_type *pmVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  char target;
  Node next;
  string conv_array [12];
  char local_309;
  tNode *local_308;
  long local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  ptVar7 = (tNode *)operator_new(0x140);
  memcpy(ptVar7,
         "xxxxxxxxxxxxxxxxxxxxxxxxxxrnbqkbnrxxxxppppppppxxxx        xxxx        xxxx        xxxx        xxxxPPPPPPPPxxxxRNBQKBNRxxxxxxxxxxxxxxxxxxxxxxxxxx"
         ,0x90);
  p_Var1 = &(ptVar7->materials)._M_t._M_impl.super__Rb_tree_header;
  (ptVar7->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar8 = 0;
  (ptVar7->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (ptVar7->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (ptVar7->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (ptVar7->materials)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (ptVar7->b_king_pos)._M_dataplus._M_p = (pointer)&(ptVar7->b_king_pos).field_2;
  (ptVar7->b_king_pos)._M_string_length = 0;
  (ptVar7->b_king_pos).field_2._M_local_buf[0] = '\0';
  (ptVar7->w_king_pos)._M_dataplus._M_p = (pointer)&(ptVar7->w_king_pos).field_2;
  (ptVar7->w_king_pos)._M_string_length = 0;
  (ptVar7->w_king_pos).field_2._M_local_buf[0] = '\0';
  (ptVar7->mv)._M_dataplus._M_p = (pointer)&(ptVar7->mv).field_2;
  (ptVar7->mv)._M_string_length = 0;
  (ptVar7->mv).field_2._M_local_buf[0] = '\0';
  (ptVar7->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ptVar7->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ptVar7->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar11 = 0;
  do {
    lVar13 = 0xc;
    lVar14 = lVar8;
    do {
      ptVar7->board[0][lVar14] = (*root)->board[0][lVar14];
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    lVar11 = lVar11 + 1;
    lVar8 = lVar8 + 0xc;
  } while (lVar11 != 0xc);
  local_300 = (long)x;
  local_309 = ptVar7->board[p][q];
  ptVar7->board[p][q] = ptVar7->board[local_300][y];
  ptVar7->board[local_300][y] = ' ';
  local_308 = ptVar7;
  bVar6 = is_repeat(&local_308);
  ptVar7 = local_308;
  if (bVar6) {
    if (local_308 != (tNode *)0x0) {
      pptVar3 = (local_308->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pptVar3 != (pointer)0x0) {
        operator_delete(pptVar3);
      }
      pcVar4 = (ptVar7->mv)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &(ptVar7->mv).field_2) {
        operator_delete(pcVar4);
      }
      pcVar4 = (ptVar7->w_king_pos)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &(ptVar7->w_king_pos).field_2) {
        operator_delete(pcVar4);
      }
      pcVar4 = (ptVar7->b_king_pos)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &(ptVar7->b_king_pos).field_2) {
        operator_delete(pcVar4);
      }
      std::
      _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
      ::~_Rb_tree(&(ptVar7->materials)._M_t);
      operator_delete(ptVar7);
      return;
    }
  }
  else {
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::operator=(&(local_308->materials)._M_t,&((*root)->materials)._M_t);
    if (local_309 != ' ') {
      pmVar9 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[](&local_308->materials,&local_309);
      *pmVar9 = *pmVar9 + -1;
    }
    std::__cxx11::string::_M_assign((string *)&local_308->w_king_pos);
    std::__cxx11::string::_M_assign((string *)&local_308->b_king_pos);
    local_308->cur_side = (bool)((*root)->cur_side ^ 1);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"0","");
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"1","");
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"2","");
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"3","");
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"4","");
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"5","");
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"6","");
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"7","");
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"8","");
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"9","");
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"10","");
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"11","");
    std::operator+(&local_1f8,"(",&local_1b8 + local_300);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    local_2f8 = &local_2e8;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_2e8 = *plVar12;
      lStack_2e0 = plVar10[3];
    }
    else {
      local_2e8 = *plVar12;
      local_2f8 = (long *)*plVar10;
    }
    local_2f0 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2f8,(ulong)(&local_1b8)[y]._M_dataplus._M_p);
    local_2d8 = &local_2c8;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_2c8 = *plVar12;
      lStack_2c0 = plVar10[3];
    }
    else {
      local_2c8 = *plVar12;
      local_2d8 = (long *)*plVar10;
    }
    local_2d0 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_2b8 = &local_2a8;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_2a8 = *plVar12;
      lStack_2a0 = plVar10[3];
    }
    else {
      local_2a8 = *plVar12;
      local_2b8 = (long *)*plVar10;
    }
    local_2b0 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298 = &local_288;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_288 = *plVar12;
      lStack_280 = plVar10[3];
    }
    else {
      local_288 = *plVar12;
      local_298 = (long *)*plVar10;
    }
    local_290 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_278 = &local_268;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_268 = *plVar12;
      lStack_260 = plVar10[3];
    }
    else {
      local_268 = *plVar12;
      local_278 = (long *)*plVar10;
    }
    local_270 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_278,(ulong)(&local_1b8)[p]._M_dataplus._M_p);
    local_258 = &local_248;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_248 = *plVar12;
      lStack_240 = plVar10[3];
    }
    else {
      local_248 = *plVar12;
      local_258 = (long *)*plVar10;
    }
    local_250 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_228 = *plVar12;
      lStack_220 = plVar10[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar12;
      local_238 = (long *)*plVar10;
    }
    local_230 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_238,(ulong)(&local_1b8)[q]._M_dataplus._M_p);
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_208 = *plVar12;
      lStack_200 = plVar10[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *plVar12;
      local_218 = (long *)*plVar10;
    }
    local_210 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_218);
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_1c8 = *plVar12;
      lStack_1c0 = plVar10[3];
      local_1d8 = &local_1c8;
    }
    else {
      local_1c8 = *plVar12;
      local_1d8 = (long *)*plVar10;
    }
    local_1d0 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_308->mv,(string *)&local_1d8);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    ptVar5 = *root;
    __position._M_current =
         (ptVar5->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (ptVar5->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<tNode*,std::allocator<tNode*>>::_M_realloc_insert<tNode*const&>
                ((vector<tNode*,std::allocator<tNode*>> *)&ptVar5->next,__position,&local_308);
    }
    else {
      *__position._M_current = local_308;
      ppptVar2 = &(ptVar5->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar2 = *ppptVar2 + 1;
    }
    lVar8 = 0;
    do {
      if (local_48 + lVar8 != *(undefined1 **)((long)local_58 + lVar8)) {
        operator_delete(*(undefined1 **)((long)local_58 + lVar8));
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x180);
  }
  return;
}

Assistant:

void tree_insert(Node& root, int x, int y, int p, int q){

    Node next = new tNode;

    // Copying the current board state to the new board state
    int a, b;
    for(a=0; a<12; a++){
        for(b=0; b<12; b++){
            next->board[a][b] = root->board[a][b];
        }
    }

    // Moving the piece from (x,y) to (p,q), replacing if needed
    char source = next->board[x][y];
    char target = next->board[p][q];
    next->board[p][q] = source;
    next->board[x][y] = ' ';

    // Checks if this board state has already been examined; skips it if it has been examined
    if(!is_repeat(next)){

        next->materials = root->materials;
        if(' ' != target)
            next->materials[target] -= 1;

        // Copying attributes from old node to new node
        next->w_king_pos = root->w_king_pos;
        next->b_king_pos = root->b_king_pos;
        next->cur_side = !(root->cur_side);

        string conv_array[12] = {"0", "1", "2", "3", "4", "5", "6", "7", "8", "9", "10", "11"};
        next->mv = "(" + conv_array[x] +  "," + conv_array[y] + ")" + "->" + "(" + conv_array[p] +  "," + conv_array[q] + ")";

        root->next.push_back(next);
    }
    else{
        delete next;
    }
}